

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallTargetGenerator.cxx
# Opt level: O0

string * cmInstallTargetGenerator::GetInstallFilename
                   (string *__return_storage_ptr__,cmTarget *target,string *config,NameType nameType
                   )

{
  bool bVar1;
  TargetType TVar2;
  undefined1 local_158 [8];
  string targetNamePDB_1;
  string targetNameImport_1;
  string targetNameReal_1;
  string targetNameSO;
  string targetName_1;
  string targetNamePDB;
  string targetNameImport;
  string targetNameReal;
  string targetName;
  NameType nameType_local;
  string *config_local;
  cmTarget *target_local;
  string *fname;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  TVar2 = cmTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    std::__cxx11::string::string((string *)(targetNameReal.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameImport.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNamePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetName_1.field_2._M_local_buf + 8));
    cmTarget::GetExecutableNames
              (target,(string *)(targetNameReal.field_2._M_local_buf + 8),
               (string *)(targetNameImport.field_2._M_local_buf + 8),
               (string *)(targetNamePDB.field_2._M_local_buf + 8),
               (string *)(targetName_1.field_2._M_local_buf + 8),config);
    if (nameType == NameImplib) {
      bVar1 = cmTarget::GetImplibGNUtoMS
                        (target,(string *)((long)&targetNamePDB.field_2 + 8),__return_storage_ptr__,
                         "${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar1) {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,
                   (string *)(targetNamePDB.field_2._M_local_buf + 8));
      }
    }
    else if (nameType == NameReal) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNameImport.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNameReal.field_2._M_local_buf + 8));
    }
    std::__cxx11::string::~string((string *)(targetName_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNamePDB.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameImport.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameReal.field_2._M_local_buf + 8));
  }
  else {
    std::__cxx11::string::string((string *)(targetNameSO.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameReal_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNameImport_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)(targetNamePDB_1.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_158);
    cmTarget::GetLibraryNames
              (target,(string *)(targetNameSO.field_2._M_local_buf + 8),
               (string *)(targetNameReal_1.field_2._M_local_buf + 8),
               (string *)(targetNameImport_1.field_2._M_local_buf + 8),
               (string *)(targetNamePDB_1.field_2._M_local_buf + 8),(string *)local_158,config);
    if (nameType == NameImplib) {
      bVar1 = cmTarget::GetImplibGNUtoMS
                        (target,(string *)((long)&targetNamePDB_1.field_2 + 8),
                         __return_storage_ptr__,"${CMAKE_IMPORT_LIBRARY_SUFFIX}");
      if (!bVar1) {
        std::__cxx11::string::operator=
                  ((string *)__return_storage_ptr__,
                   (string *)(targetNamePDB_1.field_2._M_local_buf + 8));
      }
    }
    else if (nameType == NameSO) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNameReal_1.field_2._M_local_buf + 8));
    }
    else if (nameType == NameReal) {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,
                 (string *)(targetNameImport_1.field_2._M_local_buf + 8));
    }
    else {
      std::__cxx11::string::operator=
                ((string *)__return_storage_ptr__,(string *)(targetNameSO.field_2._M_local_buf + 8))
      ;
    }
    std::__cxx11::string::~string((string *)local_158);
    std::__cxx11::string::~string((string *)(targetNamePDB_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameImport_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameReal_1.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(targetNameSO.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
cmInstallTargetGenerator::GetInstallFilename(cmTarget const* target,
                                             const std::string& config,
                                             NameType nameType)
{
  std::string fname;
  // Compute the name of the library.
  if(target->GetType() == cmTarget::EXECUTABLE)
    {
    std::string targetName;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    target->GetExecutableNames(targetName, targetNameReal,
                               targetNameImport, targetNamePDB,
                               config);
    if(nameType == NameImplib)
      {
      // Use the import library name.
      if(!target->GetImplibGNUtoMS(targetNameImport, fname,
                                   "${CMAKE_IMPORT_LIBRARY_SUFFIX}"))
        {
        fname = targetNameImport;
        }
      }
    else if(nameType == NameReal)
      {
      // Use the canonical name.
      fname = targetNameReal;
      }
    else
      {
      // Use the canonical name.
      fname = targetName;
      }
    }
  else
    {
    std::string targetName;
    std::string targetNameSO;
    std::string targetNameReal;
    std::string targetNameImport;
    std::string targetNamePDB;
    target->GetLibraryNames(targetName, targetNameSO, targetNameReal,
                            targetNameImport, targetNamePDB, config);
    if(nameType == NameImplib)
      {
      // Use the import library name.
      if(!target->GetImplibGNUtoMS(targetNameImport, fname,
                                   "${CMAKE_IMPORT_LIBRARY_SUFFIX}"))
        {
        fname = targetNameImport;
        }
      }
    else if(nameType == NameSO)
      {
      // Use the soname.
      fname = targetNameSO;
      }
    else if(nameType == NameReal)
      {
      // Use the real name.
      fname = targetNameReal;
      }
    else
      {
      // Use the canonical name.
      fname = targetName;
      }
    }

  return fname;
}